

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm2x16CaseInstance *this)

{
  float afVar1 [2];
  ulong uVar2;
  Precision PVar3;
  ShaderExecutor *pSVar4;
  TestStatus *pTVar5;
  deUint32 dVar6;
  uint uVar7;
  int iVar8;
  ostringstream *poVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar23;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  float local_238 [2];
  long lStack_230;
  long local_228;
  PackSnorm2x16CaseInstance *local_218;
  Hex<8UL> local_210;
  undefined8 local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  ulong local_1e0;
  ulong local_1d8;
  TestStatus *local_1d0;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  undefined1 auVar21 [16];
  
  dVar6 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_1c0,dVar6 ^ 0x776002);
  local_228 = 0;
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  lStack_230 = 0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar3 = this->m_precision;
  if (PVar3 == PRECISION_MEDIUMP) {
    uVar7 = 0x21;
  }
  else {
    uVar7 = 1;
    if ((PVar3 != PRECISION_HIGHP) && (uVar7 = 0x81, PVar3 != PRECISION_LOWP)) {
      uVar7 = 0;
    }
  }
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  local_218 = this;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -1.0;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = -0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -1.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = -0.75;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
             (Vector<float,_2> *)local_1b0);
  iVar8 = 0xf;
  do {
    fVar17 = deRandom_getFloat(&local_1c0);
    local_208 = (pointer)CONCAT44(extraout_XMM0_Db,fVar17);
    fVar17 = deRandom_getFloat(&local_1c0);
    local_1b0._0_4_ = (float)local_208 * 2.5 + -1.25;
    local_1b0._4_4_ = fVar17 * 2.5 + -1.25;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
               (Vector<float,_2> *)local_1b0);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  iVar8 = 0x50;
  do {
    fVar17 = deRandom_getFloat(&local_1c0);
    local_208 = (pointer)CONCAT44(extraout_XMM0_Db_00,fVar17);
    fVar17 = deRandom_getFloat(&local_1c0);
    local_1b0._0_4_ = (float)local_208 * 1e+06 + -500000.0;
    local_1b0._4_4_ = fVar17 * 1e+06 + -500000.0;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_238,
               (Vector<float,_2> *)local_1b0);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1f8,lStack_230 - (long)local_238 >> 3);
  local_1b0._0_8_ = ((local_218->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar9 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"Executing shader for ",0x15)
  ;
  local_1d0 = __return_storage_ptr__;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar9);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_1b0._0_4_ = local_238[0];
  local_1b0._4_4_ = local_238[1];
  local_210.value =
       (deUint64)
       local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  pSVar4 = (local_218->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar4->_vptr_ShaderExecutor[2])
            (pSVar4,(ulong)(lStack_230 - (long)local_238) >> 3,local_1b0,&local_210,0);
  local_1e0 = (ulong)(lStack_230 - (long)local_238) >> 3;
  uVar11 = 0;
  if (0 < (int)(uint)local_1e0) {
    uVar12 = (ulong)((uint)local_1e0 & 0x7fffffff);
    uVar13 = 0;
    uVar11 = 0;
    local_1d8 = uVar12;
    do {
      poVar9 = (ostringstream *)(local_1b0 + 8);
      uVar2 = *(ulong *)((long)local_238 + uVar13 * 8);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar2;
      auVar20 = minps(ZEXT816(0x3f8000003f800000),auVar20);
      uVar14 = -(uint)((float)uVar2 < -1.0);
      uVar15 = -(uint)((float)(uVar2 >> 0x20) < -1.0);
      fVar17 = (float)(uVar14 & 0xc6fffe00 | ~uVar14 & (uint)(auVar20._0_4_ * 32767.0));
      fVar18 = (float)(uVar15 & 0xc6fffe00 | ~uVar15 & (uint)(auVar20._4_4_ * 32767.0));
      iVar8 = -(uint)(fVar17 < 0.0);
      iVar16 = -(uint)(fVar18 < 0.0);
      auVar22._4_4_ = iVar16;
      auVar22._0_4_ = iVar8;
      auVar22._8_4_ = iVar16;
      auVar22._12_4_ = iVar16;
      auVar21._8_8_ = auVar22._8_8_;
      auVar21._4_4_ = iVar8;
      auVar21._0_4_ = iVar8;
      uVar14 = movmskpd(local_238[0],auVar21);
      fVar19 = -0.5;
      if ((uVar14 & 1) == 0) {
        fVar19 = 0.5;
      }
      fVar23 = -0.5;
      if ((uVar14 & 2) == 0) {
        fVar23 = 0.5;
      }
      fVar19 = fVar19 + fVar17;
      fVar17 = -32768.0;
      if (-32768.0 <= fVar19) {
        fVar17 = fVar19;
      }
      fVar19 = 32767.0;
      if (fVar17 <= 32767.0) {
        fVar19 = fVar17;
      }
      fVar18 = fVar18 + fVar23;
      fVar17 = -32768.0;
      if (-32768.0 <= fVar18) {
        fVar17 = fVar18;
      }
      fVar18 = 32767.0;
      if (fVar17 <= 32767.0) {
        fVar18 = fVar17;
      }
      uVar14 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      local_208 = (pointer)(ulong)uVar14;
      uVar10 = ((int)fVar19 & 0xffffU) - (uVar14 & 0xffff);
      uVar15 = -uVar10;
      if (0 < (int)uVar10) {
        uVar15 = uVar10;
      }
      uVar10 = ((int)fVar18 & 0xffffU) - (uVar14 >> 0x10);
      uVar14 = -uVar10;
      if (0 < (int)uVar10) {
        uVar14 = uVar10;
      }
      if ((uVar7 < uVar15) || (uVar7 < uVar14)) {
        if ((int)uVar11 < 10) {
          local_1b0._0_8_ = ((local_218->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          poVar9 = (ostringstream *)(local_1b0 + 8);
          local_1c8 = uVar11;
          std::__cxx11::ostringstream::ostringstream(poVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar9,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar9,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar9,", expected packSnorm2x16(",0x19);
          tcu::operator<<((ostream *)poVar9,(Vector<float,_2> *)(uVar13 * 8 + (long)local_238));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,") = ",4);
          local_210.value = (deUint64)((int)fVar18 << 0x10 | (int)fVar19 & 0xffffU);
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,", got ",6);
          local_210.value = (deUint64)local_208;
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"\n  diffs = (",0xc);
          std::ostream::operator<<(poVar9,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,", ",2);
          std::ostream::operator<<(poVar9,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"), max diff = ",0xe)
          ;
          std::ostream::operator<<(poVar9,uVar7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar9);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          uVar11 = local_1c8;
          uVar12 = local_1d8;
        }
        else if ((int)uVar11 == 10) {
          local_1b0._0_8_ = ((local_218->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar9);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          uVar12 = local_1d8;
        }
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
  }
  local_1b0._0_8_ = ((local_218->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar9 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar9);
  iVar8 = (int)local_1e0;
  std::ostream::operator<<(poVar9,iVar8 - (int)uVar11);
  pTVar5 = local_1d0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9," / ",3);
  std::ostream::operator<<(poVar9,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar9);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  afVar1 = (float  [2])((long)local_1b0 + 0x10);
  local_1b0._0_8_ = afVar1;
  if ((int)uVar11 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Pass","");
    pTVar5->m_code = QP_TEST_RESULT_PASS;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_1b0._0_8_,
               (undefined1 *)(local_1b0._8_8_ + local_1b0._0_8_));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Result comparison failed","");
    pTVar5->m_code = QP_TEST_RESULT_FAIL;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_1b0._0_8_,
               (undefined1 *)(local_1b0._8_8_ + local_1b0._0_8_));
  }
  if ((float  [2])local_1b0._0_8_ != afVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238 != (float  [2])0x0) {
    operator_delete((void *)local_238,local_228 - (long)local_238);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}